

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O2

void blobs(void)

{
  l[0].type = 'b';
  l[0].val.i = 0xe;
  l[0].val.b.data = "rtosc_is_awful";
  l[1].type = 'b';
  l[1].val.i = 0;
  l[1].val.b.data = "";
  r[0].type = 'b';
  r[0].val.i = 0x10;
  r[0].val.b.data = "rtosc_is_awesome";
  r[1].type = 'b';
  r[1].val.i = 0xb;
  r[1].val.b.data = "rtosc_is_aw";
  cmp_gt(l,r,1,1,(rtosc_cmp_options *)0x0,"one blob","another blob",0xce);
  cmp_gt(r,r + 1,1,1,(rtosc_cmp_options *)0x0,"one blob","subset blob",0xcf);
  cmp_gt(l,l + 1,1,1,(rtosc_cmp_options *)0x0,"normal blob","empty blob",0xd0);
  return;
}

Assistant:

void blobs()
{
    l[0].type = 'b';
    l[0].val.b.len = 14;
    l[0].val.b.data = (uint8_t*)"rtosc_is_awful";

    l[1].type = 'b';
    l[1].val.b.len = 0;
    l[1].val.b.data = (uint8_t*)"";

    r[0].type = 'b';
    r[0].val.b.len = 16;
    r[0].val.b.data = (uint8_t*)"rtosc_is_awesome";

    r[1].type = 'b';
    r[1].val.b.len = 11;
    r[1].val.b.data = (uint8_t*)"rtosc_is_aw";

    cmp_gt(l, r, 1, 1, NULL, "one blob", "another blob", __LINE__);
    cmp_gt(r, r+1, 1, 1, NULL, "one blob", "subset blob", __LINE__);
    cmp_gt(l, l+1, 1, 1, NULL, "normal blob", "empty blob", __LINE__);
}